

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

int mfndpos(monst *mon,coord *poss,long *info,long flag)

{
  byte *pbVar1;
  byte x;
  byte y;
  char cVar2;
  char cVar3;
  uint uVar4;
  permonst *mdat;
  monst *pmVar5;
  permonst *ppVar6;
  permonst *ppVar7;
  bool bVar8;
  xchar xVar9;
  level *lev;
  byte bVar10;
  boolean bVar11;
  int iVar12;
  obj *poVar13;
  ulong uVar14;
  char *pcVar15;
  trap *ptVar16;
  byte bVar17;
  int iVar18;
  byte y_00;
  uint uVar19;
  uint uVar20;
  byte x_00;
  int iVar21;
  byte bVar22;
  int iVar23;
  uint y_01;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  byte local_f1;
  uint local_e4;
  ulong local_e0;
  int local_bc;
  uint local_b0;
  
  mdat = mon->data;
  x = mon->mx;
  y = mon->my;
  cVar2 = mdat->mlet;
  uVar4 = mdat->mflags1;
  local_f1 = 1;
  if ((uVar4 & 0x11) == 0) {
    local_f1 = (byte)uVar4 >> 1 & cVar2 != '9';
  }
  cVar3 = level->locations[(char)x][(char)y].typ;
  bVar25 = (flag & 0x5000000U) != 0;
  bVar27 = true;
  bVar26 = true;
  if (((uint)flag >> 0x1b & 1) != 0) {
    bVar27 = true;
    bVar26 = true;
    if ((uVar4 & 0x40) != 0) {
      poVar13 = mon->mw;
      if (((poVar13 == (obj *)0x0) || ((poVar13->field_0x4a & 1) == 0)) ||
         (mon->weapon_check != '\0')) {
        poVar13 = m_carrying(mon,0x108);
        bVar27 = true;
        bVar26 = true;
        if (poVar13 == (obj *)0x0) {
          poVar13 = m_carrying(mon,0x33);
          if (poVar13 == (obj *)0x0) {
            bVar26 = false;
          }
          else {
            poVar13 = which_armor(mon,8);
            bVar26 = poVar13 == (obj *)0x0;
          }
        }
        poVar13 = m_carrying(mon,0x1b);
        if (poVar13 == (obj *)0x0) {
          poVar13 = m_carrying(mon,0x1c);
          if (poVar13 == (obj *)0x0) {
            bVar27 = false;
          }
          else {
            poVar13 = which_armor(mon,8);
            bVar27 = poVar13 == (obj *)0x0;
          }
        }
      }
      else if ((byte)(poVar13->oclass | 4U) == 6) {
        bVar26 = objects[poVar13->otyp].oc_subtyp == '\x04';
        bVar27 = objects[poVar13->otyp].oc_subtyp == '\x03';
      }
      else {
        bVar26 = false;
        bVar27 = false;
      }
    }
    bVar25 = (bool)(bVar26 | bVar27 | (flag & 0x5000000U) != 0);
    bVar26 = !bVar26;
    bVar27 = (bool)(bVar27 ^ 1);
  }
  iVar18 = (int)(char)x;
  local_b0 = (uint)(cVar2 == '9');
  iVar12 = 0x4e;
  if (iVar18 < 0x4e) {
    iVar12 = iVar18;
  }
  iVar23 = (int)(char)y;
  iVar21 = 0x13;
  if (iVar23 < 0x13) {
    iVar21 = iVar23;
  }
  bVar10 = 2;
  if (2 < iVar18) {
    bVar10 = x;
  }
  bVar10 = bVar10 - 1;
  bVar17 = 1;
  if (1 < iVar23) {
    bVar17 = y;
  }
  local_e0 = flag;
  do {
    uVar14 = local_e0 & 0xffffffffffc1ffff | 0x1e0000;
    if ((*(uint *)&mon->field_0x60 >> 0x15 & 1) == 0) {
      uVar14 = local_e0;
    }
    local_e0 = uVar14 | 0x40000000;
    if ((*(uint *)&mon->field_0x60 >> 0x11 & 1) != 0) {
      local_e0 = uVar14;
    }
    local_bc = 0;
    if ((int)(uint)bVar10 <= iVar12 + 1) {
      local_bc = 0;
      local_e4 = (uint)bVar10;
      x_00 = bVar10;
      do {
        y_01 = (uint)(byte)(bVar17 - 1);
        if ((int)y_01 <= iVar21 + 1) {
          y_00 = bVar17 - 1;
LAB_001e732a:
          if ((x_00 == x) && (y_00 == y)) goto LAB_001e7cf7;
          bVar22 = level->locations[(char)x_00][(char)y_00].typ;
          if ((0x10 < bVar22) ||
             ((((uint)local_e0 >> 0x1a & 1) != 0 &&
              (bVar11 = may_passwall(level,x_00,y_00), bVar11 != '\0')))) {
            if ((bVar22 != 0x16) || ((local_e0 & 0x10000000) != 0)) goto LAB_001e7419;
            goto LAB_001e7cf7;
          }
          bVar8 = bVar27;
          if ((bVar22 != 0xd) &&
             ((bVar22 != 0 || ((*(uint *)&(level->flags).field_0x8 & 0x100000) == 0)))) {
            bVar8 = bVar26;
          }
          if ((bVar8) || (bVar11 = may_dig(level,x_00,y_00), bVar11 == '\0')) goto LAB_001e7cf7;
LAB_001e7419:
          if ((bVar22 == 0x17) && ((mdat->mflags1 & 4) == 0)) {
            uVar19 = *(uint *)&level->locations[(char)x_00][(char)y_00].field_0x6;
            if (((uVar19 & 0x40) == 0) || ((local_e0 & 0x400000) != 0)) {
              if (((local_e0 >> 0x17 & 1) != 0 || bVar25) || -1 < (char)uVar19) goto LAB_001e746e;
            }
            else if (bVar25) goto LAB_001e746e;
            goto LAB_001e7cf7;
          }
LAB_001e746e:
          if (((x_00 != x && y_00 != y) &&
              (((mdat == mons + 0x78 ||
                ((cVar3 == '\x17' &&
                 (((*(ushort *)&level->locations[(char)x][(char)y].field_0x6 & 0x1e0) != 0 ||
                  (bVar11 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar11 != '\0')))))) ||
               ((bVar22 == 0x17 &&
                (((*(ushort *)&level->locations[(char)x_00][(char)y_00].field_0x6 & 0x1e0) != 0 ||
                 (bVar11 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar11 != '\0'))))))))
             || ((bVar11 = is_pool(level,local_e4,y_01), local_b0 != (int)bVar11 && local_f1 == 0 ||
                 (((uVar4 & 0x11) == 0 && (mdat != mons + 0x157 && mdat != mons + 0xa0) &&
                  (bVar11 = is_lava(level,local_e4,y_01), bVar11 != '\0')))))) goto LAB_001e7cf7;
          if ((mon->field_0x62 & 2) == 0) {
            bVar22 = 0;
          }
          else {
            bVar22 = 1;
            if (((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
                 (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
               (u.uprops[0xd].blocked == 0)) {
              bVar22 = *(byte *)((long)&mdat->mflags1 + 3) & 1;
            }
          }
          uVar19 = y_01;
          uVar20 = local_e4;
          if ((((u.uprops[0x2d].extrinsic != 0) && (bVar22 != 0)) && (mon->mux == x_00)) &&
             (mon->muy == y_00)) {
            uVar20 = (uint)u.ux;
            uVar19 = (uint)u.uy;
          }
          poVar13 = level->objects[(char)x_00][(char)y_00];
          lVar24 = (long)local_bc;
          info[lVar24] = 0;
          if (((poVar13 != (obj *)0x0) || (u.uprops[0x2d].extrinsic != 0)) &&
             (bVar11 = onscary(uVar20,uVar19,mon), bVar11 != '\0')) {
            if (((uint)local_e0 >> 0x1e & 1) == 0) goto LAB_001e7cf7;
            pbVar1 = (byte *)((long)info + lVar24 * 8 + 3);
            *pbVar1 = *pbVar1 | 0x40;
          }
          lev = level;
          xVar9 = u.uy;
          if (y_00 == u.uy && x_00 == u.ux) {
LAB_001e7755:
            mon->mux = u.ux;
            mon->muy = xVar9;
LAB_001e7760:
            uVar14 = 0x40000;
            uVar19 = (uint)local_e0 >> 0x12;
joined_r0x001e7919:
            if ((uVar19 & 1) == 0) goto LAB_001e7cf7;
            info[lVar24] = info[lVar24] | uVar14;
          }
          else {
            if ((x_00 == mon->mux) && (y_00 == mon->muy)) {
              if (y_00 == u.uy && x_00 == u.ux) goto LAB_001e7755;
              goto LAB_001e7760;
            }
            pmVar5 = level->monsters[(char)x_00][(char)y_00];
            if ((pmVar5 != (monst *)0x0) && ((*(uint *)&pmVar5->field_0x60 >> 9 & 1) == 0)) {
              ppVar6 = mon->data;
              ppVar7 = pmVar5->data;
              uVar19 = 0x180000;
              if ((((ppVar6 != mons + 0x77) || (ppVar7 != (permonst *)0x308330)) &&
                  (((*(uint *)&pmVar5->field_0x60 >> 0x16 & 1) != 0 || (ppVar6->msound != '!')))) &&
                 ((ppVar7->msound != '!' || ((mon->field_0x62 & 0x40) != 0)))) {
                uVar20 = ppVar6->mflags2;
                if ((((((uVar20 & 0x10) == 0) || ((ppVar7->mflags2 & 0x80) == 0)) &&
                     ((-1 < (char)uVar20 || ((ppVar7->mflags2 & 0x10) == 0)))) &&
                    (((ppVar7->mflags2 >> 9 & 1) == 0 || (ppVar6->mlet != '\x1b')))) &&
                   ((((uVar20 >> 9 & 1) == 0 || (ppVar7->mlet != '\x1b')) &&
                    (((ppVar6 != mons + 0x61 || (ppVar7 != (permonst *)0x30a0b0)) &&
                     (uVar19 = 0, ppVar7 == (permonst *)0x3060b0 && ppVar6 == mons + 0x84)))))) {
                  uVar19 = 0x180000;
                }
              }
              if (((uVar19 | (uint)local_e0) >> 0x13 & 1) == 0) goto LAB_001e7cf7;
              uVar14 = info[lVar24];
              info[lVar24] = uVar14 | 0x80000;
              if (pmVar5->mtame != '\0') {
                if (((uVar19 | (uint)local_e0) >> 0x14 & 1) == 0) goto LAB_001e7cf7;
                info[lVar24] = uVar14 | 0x180000;
              }
            }
            if (((((lev->flags).field_0x9 & 1) != 0) &&
                (pcVar15 = in_rooms(lev,x_00,y_00,10), *pcVar15 != '\0')) &&
               ((pcVar15 = in_rooms(level,x,y,10), *pcVar15 == '\0' &&
                (bVar11 = in_your_sanctuary((monst *)0x0,x_00,y_00), bVar11 != '\0')))) {
              uVar14 = 0x20000000;
              uVar19 = (uint)local_e0 >> 0x1d;
              goto joined_r0x001e7919;
            }
          }
          if (poVar13 != (obj *)0x0) {
            poVar13 = sobj_at(0x11d,level,local_e4,y_01);
            if (poVar13 != (obj *)0x0) {
              if ((int)(uint)local_e0 < 0) goto LAB_001e7cf7;
              info[lVar24] = info[lVar24] | 0x80000000;
            }
            poVar13 = sobj_at(0x214,level,local_e4,y_01);
            if (poVar13 != (obj *)0x0) {
              if (((uint)local_e0 >> 0x19 & 1) == 0) goto LAB_001e7cf7;
              pbVar1 = (byte *)((long)info + lVar24 * 8 + 3);
              *pbVar1 = *pbVar1 | 2;
            }
          }
          if ((bVar22 != 0) && (bVar11 = online2(local_e4,y_01,(int)u.ux,(int)u.uy), bVar11 != '\0')
             ) {
            if (((uint)local_e0 >> 0x15 & 1) != 0) goto LAB_001e7cf7;
            pbVar1 = (byte *)((long)info + lVar24 * 8 + 2);
            *pbVar1 = *pbVar1 | 0x20;
          }
          if (((x_00 != x && y_00 != y) && (bVar11 = bad_rock(mdat,'\0',x,y_00), bVar11 != '\0')) &&
             (bVar11 = bad_rock(mdat,'\0',x_00,y), bVar11 != '\0')) {
            if (2 < mdat->msize) goto LAB_001e7cf7;
            poVar13 = mon->minvent;
            if (poVar13 != (obj *)0x0) {
              iVar18 = 0;
              do {
                if ((poVar13->otyp != 0x214) || ((mon->data->mflags2 & 0x8000000) == 0)) {
                  iVar18 = iVar18 + poVar13->owt;
                }
                poVar13 = poVar13->nobj;
              } while (poVar13 != (obj *)0x0);
              if (600 < iVar18) goto LAB_001e7cf7;
            }
          }
          ptVar16 = t_at(level,local_e4,y_01);
          if (ptVar16 == (trap *)0x0) goto LAB_001e7cd7;
          bVar22 = ptVar16->field_0x8 & 0x1f;
          if ((byte)(bVar22 - 0x19) < 0xe8) {
            impossible("A monster looked at a very strange trap of type %d.");
            goto LAB_001e7cf7;
          }
          if (((bVar22 == 0x14) || (bVar22 == 9 && mdat != mons + 0x10a)) ||
             (((byte)(bVar22 - 0xb) < 4 &&
              (((((mdat->mflags1 & 1) != 0 || ((mdat->mflags1 & 0x10) != 0)) ||
                (mdat->mlet == '\x05')) && (u.uz.dnum != dungeon_topology.d_sokoban_dnum))))))
          goto LAB_001e7cd7;
          switch(bVar22) {
          case 4:
            goto switchD_001e7b63_caseD_4;
          case 5:
switchD_001e7b63_caseD_5:
            if ((mdat->msize < 2) || ((mdat->mflags1 & 5) != 0)) goto LAB_001e7cd7;
            if (bVar22 != 4) {
              if (bVar22 != 0x13) {
                if (bVar22 == 10) goto switchD_001e7b63_caseD_a;
                goto switchD_001e7b63_caseD_6;
              }
              goto LAB_001e7c49;
            }
switchD_001e7b63_caseD_4:
            if ((mdat->mflags1 & 1) == 0) {
joined_r0x001e7c47:
              if (bVar22 == 0x13) {
LAB_001e7c49:
                if ((mdat == mons + 0x62 || mdat == mons + 100) || (mdat->mflags1 & 4) != 0)
                goto LAB_001e7cd7;
              }
              goto switchD_001e7b63_caseD_6;
            }
            goto LAB_001e7cd7;
          case 6:
          case 7:
          case 9:
            goto switchD_001e7b63_caseD_6;
          case 8:
            goto switchD_001e7b63_caseD_8;
          case 10:
switchD_001e7b63_caseD_a:
            if ((mon->mintrinsics & 1) != 0) goto LAB_001e7cd7;
            if (bVar22 != 0x13) {
              if (bVar22 == 4) goto switchD_001e7b63_caseD_4;
              goto switchD_001e7b63_caseD_6;
            }
            goto LAB_001e7c49;
          default:
switchD_001e7b63_default:
            goto joined_r0x001e7c47;
          }
        }
LAB_001e7d06:
        x_00 = x_00 + 1;
        local_e4 = (uint)(char)x_00;
      } while ((int)local_e4 <= iVar12 + 1);
    }
    if (local_bc != 0) {
      return local_bc;
    }
    if (local_b0 == 0) {
      return 0;
    }
    bVar11 = is_pool(level,(int)(char)x,(int)(char)y);
    local_b0 = 0;
    if (bVar11 != '\0') {
      return 0;
    }
  } while( true );
switchD_001e7b63_caseD_8:
  if ((mon->mintrinsics & 4) != 0) goto LAB_001e7cd7;
  if (9 < bVar22) {
    if (bVar22 != 10) goto switchD_001e7b63_default;
    goto switchD_001e7b63_caseD_a;
  }
  if (bVar22 == 4) goto switchD_001e7b63_caseD_4;
  if (bVar22 == 5) goto switchD_001e7b63_caseD_5;
switchD_001e7b63_caseD_6:
  if ((((uint)local_e0 >> 0x11 & 1) != 0) ||
     ((mon->mtrapseen & (uint)(1L << (bVar22 - 1 & 0x3f))) == 0)) {
    pbVar1 = (byte *)((long)info + lVar24 * 8 + 2);
    *pbVar1 = *pbVar1 | 2;
LAB_001e7cd7:
    poss[lVar24].x = x_00;
    poss[lVar24].y = y_00;
    local_bc = local_bc + 1;
  }
LAB_001e7cf7:
  y_00 = y_00 + 1;
  y_01 = (uint)(char)y_00;
  if (iVar21 + 1 < (int)y_01) goto LAB_001e7d06;
  goto LAB_001e732a;
}

Assistant:

int mfndpos(struct monst *mon,
	    coord *poss,	/* coord poss[9] */
	    long *info,		/* long info[9] */
	    long flag)
{
	const struct permonst *mdat = mon->data;
	xchar x,y,nx,ny;
	int cnt = 0;
	uchar ntyp;
	uchar nowtyp;
	boolean wantpool,poolok,lavaok,nodiag;
	boolean rockok = FALSE, treeok = FALSE, thrudoor;
	int maxx, maxy;

	x = mon->mx;
	y = mon->my;
	nowtyp = level->locations[x][y].typ;

	nodiag = (mdat == &mons[PM_GRID_BUG]);
	wantpool = mdat->mlet == S_EEL;
	poolok = is_flyer(mdat) || is_clinger(mdat) ||
		 (is_swimmer(mdat) && !wantpool);
	lavaok = is_flyer(mdat) || is_clinger(mdat) || likes_lava(mdat);
	thrudoor = ((flag & (ALLOW_WALL|BUSTDOOR)) != 0L);
	if (flag & ALLOW_DIG) {
	    struct obj *mw_tmp;

	    /* need to be specific about what can currently be dug */
	    if (!needspick(mdat)) {
		rockok = treeok = TRUE;
	    } else if ((mw_tmp = MON_WEP(mon)) && mw_tmp->cursed &&
		       mon->weapon_check == NO_WEAPON_WANTED) {
		rockok = is_pick(mw_tmp);
		treeok = is_axe(mw_tmp);
	    } else {
		rockok = (m_carrying(mon, PICK_AXE) ||
			  (m_carrying(mon, DWARVISH_MATTOCK) &&
			   !which_armor(mon, W_ARMS)));
		treeok = (m_carrying(mon, AXE) ||
			  (m_carrying(mon, BATTLE_AXE) &&
			   !which_armor(mon, W_ARMS)));
	    }
	    thrudoor |= rockok || treeok;
	}

nexttry:	/* eels prefer the water, but if there is no water nearby,
		   they will crawl over land */
	if (mon->mconf) {
		flag |= ALLOW_ALL;
		flag &= ~NOTONL;
	}
	if (!mon->mcansee)
		flag |= ALLOW_SSM;
	maxx = min(x+1,COLNO-1);
	maxy = min(y+1,ROWNO-1);
	for (nx = max(1,x-1); nx <= maxx; nx++)
	  for (ny = max(0,y-1); ny <= maxy; ny++) {
	    if (nx == x && ny == y) continue;
	    if (IS_ROCK(ntyp = level->locations[nx][ny].typ) &&
	       !((flag & ALLOW_WALL) && may_passwall(level, nx,ny)) &&
	       !((IS_TREE(level, ntyp) ? treeok : rockok) && may_dig(level, nx,ny))) continue;
	    /* KMH -- Added iron bars */
	    if (ntyp == IRONBARS && !(flag & ALLOW_BARS)) continue;
	    if (IS_DOOR(ntyp) && !amorphous(mdat) &&
	       ((level->locations[nx][ny].doormask & D_CLOSED && !(flag & OPENDOOR)) ||
		(level->locations[nx][ny].doormask & D_LOCKED && !(flag & UNLOCKDOOR))) &&
	       !thrudoor) continue;
	    if (nx != x && ny != y && (nodiag ||
	       ((IS_DOOR(nowtyp) &&
		 ((level->locations[x][y].doormask & ~D_BROKEN) || Is_rogue_level(&u.uz))) ||
		(IS_DOOR(ntyp) &&
		 ((level->locations[nx][ny].doormask & ~D_BROKEN) || Is_rogue_level(&u.uz))))
	       ))
		continue;
	    if ((is_pool(level, nx,ny) == wantpool || poolok) &&
	       (lavaok || !is_lava(level, nx,ny))) {
		int dispx, dispy;
		boolean monseeu = (mon->mcansee && (!Invis || perceives(mdat)));
		boolean checkobj = OBJ_AT(nx, ny);

		/* Displacement also displaces the Elbereth/scare monster,
		 * as long as you are visible.
		 */
		if (Displaced && monseeu && (mon->mux==nx) && (mon->muy==ny)) {
		    dispx = u.ux;
		    dispy = u.uy;
		} else {
		    dispx = nx;
		    dispy = ny;
		}

		info[cnt] = 0;
		if ((checkobj || Displaced) && onscary(dispx, dispy, mon)) {
		    if (!(flag & ALLOW_SSM)) continue;
		    info[cnt] |= ALLOW_SSM;
		}
		if ((nx == u.ux && ny == u.uy) ||
		   (nx == mon->mux && ny == mon->muy)) {
			if (nx == u.ux && ny == u.uy) {
				/* If it's right next to you, it found you,
				 * displaced or no.  We must set mux and muy
				 * right now, so when we return we can tell
				 * that the ALLOW_U means to attack _you_ and
				 * not the image.
				 */
				mon->mux = u.ux;
				mon->muy = u.uy;
			}
			if (!(flag & ALLOW_U)) continue;
			info[cnt] |= ALLOW_U;
		} else {
			if (MON_AT(level, nx, ny)) {
				struct monst *mtmp2 = m_at(level, nx, ny);
				long mmflag = flag | mm_aggression(mon, mtmp2);

				if (!(mmflag & ALLOW_M)) continue;
				info[cnt] |= ALLOW_M;
				if (mtmp2->mtame) {
					if (!(mmflag & ALLOW_TM)) continue;
					info[cnt] |= ALLOW_TM;
				}
			}
			/* Note: ALLOW_SANCT only prevents movement, not */
			/* attack, into a temple. */
			if (level->flags.has_temple &&
			   *in_rooms(level, nx, ny, TEMPLE) &&
			   !*in_rooms(level, x, y, TEMPLE) &&
			   in_your_sanctuary(NULL, nx, ny)) {
				if (!(flag & ALLOW_SANCT)) continue;
				info[cnt] |= ALLOW_SANCT;
			}
		}
		if (checkobj && sobj_at(CLOVE_OF_GARLIC, level, nx, ny)) {
			if (flag & NOGARLIC) continue;
			info[cnt] |= NOGARLIC;
		}
		if (checkobj && sobj_at(BOULDER, level, nx, ny)) {
			if (!(flag & ALLOW_ROCK)) continue;
			info[cnt] |= ALLOW_ROCK;
		}
		if (monseeu && onlineu(nx,ny)) {
			if (flag & NOTONL) continue;
			info[cnt] |= NOTONL;
		}
		if (nx != x && ny != y && bad_rock(mdat, FALSE, x, ny)
			    && bad_rock(mdat, FALSE, nx, y)
			    && (bigmonst(mdat) || (curr_mon_load(mon) > 600)))
			continue;
		/* The monster avoids a particular type of trap if it's familiar
		 * with the trap type.  Pets get ALLOW_TRAPS and checking is
		 * done in dogmove.c.  In either case, "harmless" traps are
		 * neither avoided nor marked in info[].
		 */
		{ struct trap *ttmp = t_at(level, nx, ny);
		    if (ttmp) {
			if (ttmp->ttyp >= TRAPNUM || ttmp->ttyp == 0)  {
impossible("A monster looked at a very strange trap of type %d.", ttmp->ttyp);
			    continue;
			}
			if ((ttmp->ttyp != RUST_TRAP
					|| mdat == &mons[PM_IRON_GOLEM])
				&& ttmp->ttyp != STATUE_TRAP
				&& ((ttmp->ttyp != PIT
				    && ttmp->ttyp != SPIKED_PIT
				    && ttmp->ttyp != TRAPDOOR
				    && ttmp->ttyp != HOLE)
				      || (!is_flyer(mdat)
				    && !is_floater(mdat)
				    && !is_clinger(mdat))
				      || In_sokoban(&u.uz))
				&& (ttmp->ttyp != SLP_GAS_TRAP ||
				    !resists_sleep(mon))
				&& (ttmp->ttyp != BEAR_TRAP ||
				    (mdat->msize > MZ_SMALL &&
				     !amorphous(mdat) && !is_flyer(mdat)))
				&& (ttmp->ttyp != FIRE_TRAP ||
				    !resists_fire(mon))
				&& (ttmp->ttyp != SQKY_BOARD || !is_flyer(mdat))
				&& (ttmp->ttyp != WEB || (!amorphous(mdat) &&
				    !webmaker(mdat)))
			) {
			    if (!(flag & ALLOW_TRAPS)) {
				if (mon->mtrapseen & (1L << (ttmp->ttyp - 1)))
				    continue;
			    }
			    info[cnt] |= ALLOW_TRAPS;
			}
		    }
		}
		poss[cnt].x = nx;
		poss[cnt].y = ny;
		cnt++;
	    }
	}
	if (!cnt && wantpool && !is_pool(level, x,y)) {
		wantpool = FALSE;
		goto nexttry;
	}
	return cnt;
}